

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatGeneric
          (TimeZoneFormat *this,TimeZone *tz,int32_t genType,UDate date,UnicodeString *name)

{
  UChar *this_00;
  UBool UVar1;
  ConstChar16Ptr local_98;
  UnicodeString local_90;
  UChar *local_50;
  UChar *canonicalID;
  TimeZoneGenericNames *gnames;
  TimeZoneFormat *pTStack_38;
  UErrorCode status;
  UnicodeString *name_local;
  UDate date_local;
  TimeZone *pTStack_20;
  int32_t genType_local;
  TimeZone *tz_local;
  TimeZoneFormat *this_local;
  
  gnames._4_4_ = U_ZERO_ERROR;
  pTStack_38 = (TimeZoneFormat *)name;
  name_local = (UnicodeString *)date;
  date_local._4_4_ = genType;
  pTStack_20 = tz;
  tz_local = (TimeZone *)this;
  canonicalID = (UChar *)getTimeZoneGenericNames(this,(UErrorCode *)((long)&gnames + 4));
  UVar1 = ::U_FAILURE(gnames._4_4_);
  if (UVar1 == '\0') {
    if (date_local._4_4_ == UTZGNM_LOCATION) {
      local_50 = ZoneMeta::getCanonicalCLDRID(pTStack_20);
      this_00 = canonicalID;
      if (local_50 == (UChar *)0x0) {
        UnicodeString::setToBogus((UnicodeString *)pTStack_38);
        this_local = pTStack_38;
      }
      else {
        ConstChar16Ptr::ConstChar16Ptr(&local_98,local_50);
        UnicodeString::UnicodeString(&local_90,'\x01',&local_98,-1);
        this_local = (TimeZoneFormat *)
                     TimeZoneGenericNames::getGenericLocationName
                               ((TimeZoneGenericNames *)this_00,&local_90,
                                (UnicodeString *)pTStack_38);
        UnicodeString::~UnicodeString(&local_90);
        ConstChar16Ptr::~ConstChar16Ptr(&local_98);
      }
    }
    else {
      this_local = (TimeZoneFormat *)
                   TimeZoneGenericNames::getDisplayName
                             ((TimeZoneGenericNames *)canonicalID,pTStack_20,date_local._4_4_,
                              (UDate)name_local,(UnicodeString *)pTStack_38);
    }
  }
  else {
    UnicodeString::setToBogus((UnicodeString *)pTStack_38);
    this_local = pTStack_38;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatGeneric(const TimeZone& tz, int32_t genType, UDate date, UnicodeString& name) const {
    UErrorCode status = U_ZERO_ERROR;
    const TimeZoneGenericNames* gnames = getTimeZoneGenericNames(status);
    if (U_FAILURE(status)) {
        name.setToBogus();
        return name;
    }

    if (genType == UTZGNM_LOCATION) {
        const UChar* canonicalID = ZoneMeta::getCanonicalCLDRID(tz);
        if (canonicalID == NULL) {
            name.setToBogus();
            return name;
        }
        return gnames->getGenericLocationName(UnicodeString(TRUE, canonicalID, -1), name);
    }
    return gnames->getDisplayName(tz, (UTimeZoneGenericNameType)genType, date, name);
}